

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Clara::Parser::parseIntoTokens
          (Parser *this,int argc,char **argv,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens)

{
  pointer pTVar1;
  allocator local_51;
  string local_50 [36];
  int local_2c;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *pvStack_28;
  int i;
  vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens_local;
  char **argv_local;
  Parser *pPStack_10;
  int argc_local;
  Parser *this_local;
  
  pvStack_28 = tokens;
  tokens_local = (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *)argv;
  argv_local._4_4_ = argc;
  pPStack_10 = this;
  for (local_2c = 1; local_2c < argv_local._4_4_; local_2c = local_2c + 1) {
    pTVar1 = (&(tokens_local->
               super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>).
               _M_impl.super__Vector_impl_data._M_start)[local_2c];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(char *)pTVar1,&local_51);
    parseIntoTokens(this,(string *)local_50,pvStack_28);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return;
}

Assistant:

void parseIntoTokens( int argc, char const * const * argv, std::vector<Parser::Token>& tokens ) const {
            for( int i = 1; i < argc; ++i )
                parseIntoTokens( argv[i] , tokens);
        }